

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_ctr.c
# Opt level: O1

void qsoundc_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  long lVar2;
  short *psVar3;
  short *psVar4;
  size_t __n;
  ushort uVar5;
  int iVar6;
  char cVar7;
  short sVar8;
  undefined2 uVar9;
  int iVar10;
  short sVar11;
  ushort uVar12;
  int iVar13;
  undefined2 *puVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  INT16 (*paIVar20) [95];
  long lVar21;
  uint uVar22;
  long lVar23;
  short sVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  short sVar29;
  long lVar28;
  ulong uVar30;
  bool bVar31;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (samples != 0) {
    lVar2 = (long)param + 0xfd2;
    uVar30 = 0;
    do {
      uVar12 = *(ushort *)((long)param + 0x1490);
      if (uVar12 < 0x314) {
        if (uVar12 == 0x39) {
          lVar18 = 0;
          do {
            *(undefined8 *)((long)param + lVar18 + 0xcb8) = 0x5f;
            uVar12 = *(ushort *)((long)param + lVar18 + 0xcc0);
            if ((uVar12 - 0xf2e & 0xffff) < 0xd1) {
              paIVar20 = (INT16 (*) [95])(qsound_filter_data2 + (uVar12 - 0xf2e));
            }
            else if ((ushort)(uVar12 - 0xcf5) < 0x239) {
              iVar10 = (uint)uVar12 +
                       (int)((ulong)((long)(int)(uVar12 - 0xd53) * -0x53896e7b) >> 0x20) + -0xd53;
              paIVar20 = qsound_filter_data + (uint)((iVar10 >> 6) - (iVar10 >> 0x1f));
            }
            else {
              paIVar20 = (INT16 (*) [95])0x0;
            }
            if (paIVar20 != (INT16 (*) [95])0x0) {
              memcpy((void *)((long)param + 0xcc2 + lVar18),paIVar20,0xbe);
            }
            lVar18 = lVar18 + 0x188;
          } while (lVar18 == 0x188);
          *(undefined4 *)((long)param + 0x1490) = 0x3140314;
        }
        else {
          if (uVar12 != 0x4f) goto LAB_0016962f;
          lVar18 = 0;
          do {
            *(undefined8 *)((long)param + lVar18 + 0xcb8) = 0x2d;
            uVar12 = *(ushort *)((long)param + lVar18 + 0xcc0);
            if ((uVar12 - 0xf2e & 0xffff) < 0xd1) {
              paIVar20 = (INT16 (*) [95])(qsound_filter_data2 + (uVar12 - 0xf2e));
            }
            else if ((ushort)(uVar12 - 0xcf5) < 0x239) {
              iVar10 = (uint)uVar12 +
                       (int)((ulong)((long)(int)(uVar12 - 0xd53) * -0x53896e7b) >> 0x20) + -0xd53;
              paIVar20 = qsound_filter_data + (uint)((iVar10 >> 6) - (iVar10 >> 0x1f));
            }
            else {
              paIVar20 = (INT16 (*) [95])0x0;
            }
            if (paIVar20 != (INT16 (*) [95])0x0) {
              memcpy((void *)(lVar2 + lVar18 + -0x310),paIVar20,0x5a);
            }
            *(undefined8 *)((long)param + lVar18 + 0xfc8) = 0x2c;
            uVar12 = *(ushort *)((long)param + lVar18 + 0xfd0);
            if ((uVar12 - 0xf2e & 0xffff) < 0xd1) {
              paIVar20 = (INT16 (*) [95])(qsound_filter_data2 + (uVar12 - 0xf2e));
            }
            else if ((ushort)(uVar12 - 0xcf5) < 0x239) {
              iVar10 = (uint)uVar12 +
                       (int)((ulong)((long)(int)(uVar12 - 0xd53) * -0x53896e7b) >> 0x20) + -0xd53;
              paIVar20 = qsound_filter_data + (uint)((iVar10 >> 6) - (iVar10 >> 0x1f));
            }
            else {
              paIVar20 = (INT16 (*) [95])0x0;
            }
            if (paIVar20 != (INT16 (*) [95])0x0) {
              memcpy((void *)(lVar2 + lVar18),paIVar20,0x58);
            }
            lVar18 = lVar18 + 0x188;
          } while (lVar18 == 0x188);
          *(undefined4 *)((long)param + 0x1490) = 0x6b206b2;
        }
      }
      else if ((uVar12 == 0x314) || (uVar12 == 0x6b2)) {
        sVar11 = -0x554;
        if (uVar12 == 0x6b2) {
          sVar11 = -0x53c;
        }
        *(undefined1 *)((long)param + 0x149c) = 0x80;
        sVar11 = sVar11 + *(short *)((long)param + 0x4ae);
        lVar18 = 0;
        sVar8 = 0;
        if (0 < sVar11) {
          sVar8 = sVar11;
        }
        if (0x3ff < sVar8) {
          sVar8 = 0x400;
        }
        *(short *)((long)param + 0x4b2) = sVar8;
        uVar26 = *(uint *)((long)param + 0x18);
        lVar21 = 0;
        iVar10 = 0;
        do {
          uVar22 = 0;
          if ((uVar26 >> ((uint)lVar21 & 0x1f) & 1) == 0) {
            uVar12 = *(ushort *)((long)param + lVar18 + 0x332);
            uVar5 = *(ushort *)((long)param + lVar18 + 0x334);
            if (((short)uVar12 < 0) && (uVar22 = 0, *(int *)((long)param + 0x14) != 0)) {
              uVar22 = (uint)(short)((ushort)*(byte *)(*(long *)((long)param + 8) +
                                                      ((ulong)((uVar12 & 0x7fff) << 0x10) |
                                                      (ulong)uVar5)) << 8);
            }
            uVar25 = (uint)(*(ushort *)((long)param + lVar18 + 0x336) >> 4) +
                     (uint)*(ushort *)((long)param + lVar18 + 0x338) + (short)uVar5 * 0x1000;
            if ((int)*(short *)((long)param + lVar18 + 0x33c) <= (int)uVar25 >> 0xc) {
              uVar25 = uVar25 + *(short *)((long)param + lVar18 + 0x33a) * -0x1000;
            }
            uVar22 = uVar22 * (int)*(short *)((long)param + lVar18 + 0x33e) >> 0xe;
            iVar10 = iVar10 + (int)*(short *)((long)param + lVar18 + 0x340) * (int)(short)uVar22 * 4
            ;
            if ((int)uVar25 < -0x7ffffff) {
              uVar25 = 0xf8000000;
            }
            if (0x7fffffe < (int)uVar25) {
              uVar25 = 0x7ffffff;
            }
            *(short *)((long)param + lVar18 + 0x334) = (short)(uVar25 >> 0xc);
            *(short *)((long)param + lVar18 + 0x336) = (short)(uVar25 << 4);
          }
          *(short *)((long)param + lVar21 * 2 + 0x488) = (short)uVar22;
          lVar21 = lVar21 + 1;
          lVar18 = lVar18 + 0x10;
        } while (lVar21 != 0x10);
        iVar6 = *(int *)((long)param + 0x1498);
        uVar22 = iVar6 % 3 + 0x10;
        uVar17 = (ulong)uVar22;
        if ((uVar26 >> (uVar22 & 0x1f) & 1) == 0) {
          puVar14 = (undefined2 *)((long)param + (long)(iVar6 % 3) * 0x10 + 0x432);
          if (iVar6 + 2U < 5) {
            if (puVar14[7] == puVar14[1]) {
              puVar14[5] = 0;
            }
            if (puVar14[4] != 0) {
              *(undefined2 *)((long)param + uVar17 * 2 + 0x488) = 0;
              puVar14[4] = 0;
              puVar14[6] = 10;
              puVar14[5] = puVar14[3];
              puVar14[7] = *puVar14;
            }
            cVar7 = '\0';
            if (((short)puVar14[2] < 0) && (cVar7 = '\0', *(int *)((long)param + 0x14) != 0)) {
              cVar7 = *(char *)(*(long *)((long)param + 8) +
                               ((ulong)(((ushort)puVar14[2] & 0x7fff) << 0x10) |
                               (ulong)(ushort)puVar14[7]));
            }
          }
          else {
            uVar12 = puVar14[7];
            puVar14[7] = uVar12 + 1;
            cVar7 = '\0';
            if (((short)puVar14[2] < 0) && (cVar7 = '\0', *(int *)((long)param + 0x14) != 0)) {
              cVar7 = *(char *)(*(long *)((long)param + 8) +
                               ((ulong)(((ushort)puVar14[2] & 0x7fff) << 0x10) | (ulong)uVar12)) <<
                      4;
            }
          }
          iVar19 = (int)cVar7 >> 4;
          uVar26 = iVar19 * -2;
          if (iVar19 * -2 < 0) {
            uVar26 = iVar19 * 2;
          }
          sVar11 = puVar14[6];
          iVar13 = (int)((uVar26 | 1) * (int)sVar11) >> 1;
          iVar16 = -iVar13;
          if (0 < iVar19) {
            iVar16 = iVar13;
          }
          iVar16 = *(short *)((long)param + uVar17 * 2 + 0x488) + iVar16;
          if (iVar16 < -0x7fff) {
            iVar16 = -0x8000;
          }
          if (0x7ffe < iVar16) {
            iVar16 = 0x7fff;
          }
          *(short *)((long)param + uVar17 * 2 + 0x488) =
               (short)((uint)((short)puVar14[5] * iVar16) >> 0x10);
          sVar8 = (short)((uint)((int)adpcm_step_table[iVar19 + 8] * (int)sVar11) >> 6);
          sVar11 = sVar8;
          if (sVar8 < 1) {
            sVar11 = 1;
          }
          if (2000 < sVar8) {
            sVar11 = 2000;
          }
          puVar14[6] = sVar11;
        }
        else {
          *(undefined2 *)((long)param + uVar17 * 2 + 0x488) = 0;
        }
        sVar11 = *(short *)((long)param + 0xcb6);
        sVar8 = *(short *)((long)param + (long)sVar11 * 2 + 0x4b6);
        sVar29 = *(short *)((long)param + 0x4b4);
        *(short *)((long)param + 0x4b4) = sVar8;
        iVar19 = (int)sVar29 + (int)sVar8 >> 1;
        *(short *)((long)param + 0xcb6) = sVar11 + 1;
        *(short *)((long)param + (long)sVar11 * 2 + 0x4b6) =
             (short)((uint)(iVar10 + *(short *)((long)param + 0x4b0) * iVar19 * 4) >> 0x10);
        if (*(short *)((long)param + 0x4b2) <= *(short *)((long)param + 0xcb6)) {
          *(undefined2 *)((long)param + 0xcb6) = 0;
        }
        uVar26 = iVar19 << 0xe;
        lVar18 = lVar2;
        lVar21 = (long)param + 0xcc2;
        lVar23 = 0;
        do {
          uVar22 = 0;
          if (lVar23 == 1) {
            uVar22 = uVar26;
          }
          uVar25 = 0;
          if (lVar23 == 0) {
            uVar25 = uVar26;
          }
          lVar28 = lVar23 * 0x188;
          lVar27 = -0x26;
          do {
            uVar12 = *(short *)((long)param + lVar27 + 0x488) - 0x110;
            if (0x60 < uVar12) {
              uVar12 = 0x61;
            }
            iVar10 = (int)*(short *)((long)param + lVar27 + 0x4ae);
            uVar25 = uVar25 - *(short *)((long)param + (ulong)uVar12 * 2 + lVar28 + 0x22) * iVar10;
            uVar22 = uVar22 - *(short *)((long)param + (ulong)uVar12 * 2 + lVar28 + 0xe6) * iVar10;
            lVar27 = lVar27 + 2;
          } while (lVar27 != 0);
          if ((int)uVar25 < -0x1ffffffe) {
            uVar25 = 0xe0000001;
          }
          if (0x1ffffffe < (int)uVar25) {
            uVar25 = 0x1fffffff;
          }
          if ((int)uVar22 < -0x1ffffffe) {
            uVar22 = 0xe0000001;
          }
          if (0x1ffffffe < (int)uVar22) {
            uVar22 = 0x1fffffff;
          }
          iVar10 = *(int *)((long)param + lVar28 + 0xcb8);
          uVar1 = iVar10 - 1;
          uVar17 = (ulong)uVar1;
          if (iVar10 < 2) {
            iVar10 = 0;
            uVar17 = 0;
          }
          else {
            iVar19 = *(int *)((long)param + lVar28 + 0xcbc);
            uVar15 = 0;
            iVar10 = 0;
            do {
              iVar16 = iVar19 + 1;
              iVar10 = iVar10 + (int)*(short *)((long)param + (long)iVar19 * 2 + lVar28 + 0xd80) *
                                (int)*(short *)(lVar21 + uVar15 * 2) * -4;
              iVar19 = iVar16;
              if ((int)uVar1 <= iVar16) {
                iVar19 = 0;
              }
              uVar15 = uVar15 + 1;
            } while (uVar17 != uVar15);
            *(int *)((long)param + lVar28 + 0xcbc) = iVar19;
          }
          sVar11 = *(short *)((long)param + uVar17 * 2 + lVar28 + 0xcc2);
          iVar19 = *(int *)((long)param + lVar28 + 0xcbc);
          iVar16 = iVar19 + 1;
          *(int *)((long)param + lVar28 + 0xcbc) = iVar16;
          sVar8 = (short)(uVar22 >> 0xe);
          *(short *)((long)param + (long)iVar19 * 2 + lVar28 + 0xd80) = sVar8;
          if ((int)uVar1 <= iVar16) {
            *(undefined4 *)((long)param + lVar28 + 0xcbc) = 0;
          }
          if (*(short *)((long)param + 0x1490) == 0x6b2) {
            iVar19 = *(int *)((long)param + lVar28 + 0xfc8);
            uVar22 = iVar19 - 1;
            uVar17 = (ulong)uVar22;
            if (iVar19 < 2) {
              iVar19 = 0;
              uVar17 = 0;
            }
            else {
              iVar16 = *(int *)((long)param + lVar28 + 0xfcc);
              uVar15 = 0;
              iVar19 = 0;
              do {
                iVar13 = iVar16 + 1;
                iVar19 = iVar19 + (int)*(short *)((long)param + (long)iVar16 * 2 + lVar28 + 0x1090)
                                  * (int)*(short *)(lVar18 + uVar15 * 2) * -4;
                iVar16 = iVar13;
                if ((int)uVar22 <= iVar13) {
                  iVar16 = 0;
                }
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
              *(int *)((long)param + lVar28 + 0xfcc) = iVar16;
            }
            sVar29 = *(short *)((long)param + uVar17 * 2 + lVar28 + 0xfd2);
            iVar16 = *(int *)((long)param + lVar28 + 0xfcc);
            iVar13 = iVar16 + 1;
            *(int *)((long)param + lVar28 + 0xfcc) = iVar13;
            sVar24 = (short)(uVar25 >> 0xe);
            *(short *)((long)param + (long)iVar16 * 2 + lVar28 + 0x1090) = sVar24;
            if ((int)uVar22 <= iVar13) {
              *(undefined4 *)((long)param + lVar28 + 0xfcc) = 0;
            }
            sVar29 = (short)((uint)(iVar19 + (int)sVar24 * (int)sVar29 * -4) >> 0x10);
          }
          else {
            sVar29 = (short)((uVar25 << 2) >> 0x10);
          }
          lVar27 = lVar23 * 0x6e;
          psVar3 = (short *)((long)param + lVar27 + 0x12d8);
          sVar24 = *(short *)((long)param + lVar27 + 0x12dc);
          *(short *)((long)param + lVar27 + 0x12dc) = sVar24 + 1;
          psVar3[(long)sVar24 + 4] = (short)((uint)(iVar10 + (int)sVar8 * (int)sVar11 * -4) >> 0x10)
          ;
          if (0x32 < *(short *)((long)param + lVar27 + 0x12dc)) {
            psVar3[2] = 0;
          }
          sVar11 = psVar3[3];
          sVar24 = sVar11 + 1;
          psVar3[3] = sVar24;
          sVar11 = psVar3[(long)sVar11 + 4];
          sVar8 = psVar3[1];
          if (0x32 < sVar24) {
            sVar24 = 0;
          }
          psVar3[3] = sVar24;
          psVar4 = (short *)((long)param + lVar27 + 0x13b4);
          sVar24 = *(short *)((long)param + lVar27 + 0x13b8);
          *(short *)((long)param + lVar27 + 0x13b8) = sVar24 + 1;
          psVar4[(long)sVar24 + 4] = sVar29;
          if (0x32 < *(short *)((long)param + lVar27 + 0x13b8)) {
            psVar4[2] = 0;
          }
          sVar29 = psVar4[3];
          sVar24 = sVar29 + 1;
          psVar4[3] = sVar24;
          if (0x32 < sVar24) {
            sVar24 = 0;
          }
          iVar10 = (int)sVar8 * (int)sVar11 + (int)psVar4[1] * (int)psVar4[(long)sVar29 + 4] +
                   0x2000 >> 0xe;
          if (iVar10 < -0x7ffe) {
            iVar10 = -0x7fff;
          }
          uVar9 = (undefined2)iVar10;
          if (0x7ffe < iVar10) {
            uVar9 = 0x7fff;
          }
          psVar4[3] = sVar24;
          *(undefined2 *)((long)param + lVar23 * 2 + 0x1e) = uVar9;
          if (*(short *)((long)param + 0x1494) != 0) {
            iVar10 = (int)psVar3[2] - (int)*psVar3;
            sVar11 = (short)iVar10 + 0x33 + (short)(iVar10 / 0x33) * -0x33;
            if (-1 < iVar10 % 0x33) {
              sVar11 = (short)(iVar10 % 0x33);
            }
            psVar3[3] = sVar11;
            iVar10 = (int)psVar4[2] - (int)*psVar4;
            sVar11 = (short)iVar10 + 0x33 + (short)(iVar10 / 0x33) * -0x33;
            if (-1 < iVar10 % 0x33) {
              sVar11 = (short)(iVar10 % 0x33);
            }
            psVar4[3] = sVar11;
          }
          lVar21 = lVar21 + 0x188;
          lVar18 = lVar18 + 0x188;
          bVar31 = lVar23 == 0;
          lVar23 = lVar23 + 1;
        } while (bVar31);
        *(undefined2 *)((long)param + 0x1494) = 0;
        *(int *)((long)param + 0x1498) = iVar6 + 1;
        if (4 < iVar6) goto LAB_00169c8d;
      }
      else {
LAB_0016962f:
        if (*(int *)((long)param + 0x1498) < 2) {
          if (*(int *)((long)param + 0x1498) == 1) {
            *(undefined4 *)((long)param + 0x1498) = 2;
          }
          else {
            memset((void *)((long)param + 0x332),0,0x130);
            memset((void *)((long)param + 0x4ae),0,0xfe2);
            lVar18 = -0x26;
            do {
              *(undefined2 *)((long)param + lVar18 + 0x488) = 0x120;
              *(undefined2 *)((long)param + lVar18 + 0x4ae) = 0;
              lVar18 = lVar18 + 2;
            } while (lVar18 != 0);
            lVar18 = 0;
            do {
              *(undefined2 *)((long)param + lVar18 + 0x332) = 0x8000;
              lVar18 = lVar18 + 0x10;
            } while (lVar18 != 0x100);
            lVar18 = 0;
            do {
              *(undefined2 *)((long)param + lVar18 + 0x436) = 0x8000;
              lVar18 = lVar18 + 0x10;
            } while (lVar18 != 0x30);
            if (uVar12 == 0x61a) {
              *(undefined2 *)((long)param + 0x12d8) = 1;
              *(undefined2 *)((long)param + 0x13b4) = 0;
              *(undefined2 *)((long)param + 0x1346) = 0;
              *(undefined2 *)((long)param + 0x1422) = 0;
              *(undefined2 *)((long)param + 0xcc0) = 0xf73;
              *(undefined2 *)((long)param + 0xe48) = 0xfa4;
              *(undefined2 *)((long)param + 0xfd0) = 0xf73;
              *(undefined2 *)((long)param + 0x1158) = 0xfa4;
              *(undefined2 *)((long)param + 0x4ae) = 0x542;
              *(undefined2 *)((long)param + 0x1492) = 0x4f;
            }
            else {
              *(undefined2 *)((long)param + 0x12d8) = 0;
              *(undefined2 *)((long)param + 0x13b4) = 0x2e;
              *(undefined2 *)((long)param + 0x1346) = 0;
              *(undefined2 *)((long)param + 0x1422) = 0x30;
              *(undefined2 *)((long)param + 0xcc0) = 0xdb2;
              *(undefined2 *)((long)param + 0xe48) = 0xe11;
              *(undefined2 *)((long)param + 0x4ae) = 0x55a;
              *(undefined2 *)((long)param + 0x1492) = 0x39;
            }
            *(undefined2 *)((long)param + 0x12da) = 0x3fff;
            *(undefined2 *)((long)param + 0x13b6) = 0x3fff;
            *(undefined2 *)((long)param + 0x1348) = 0x3fff;
            *(undefined2 *)((long)param + 0x1424) = 0x3fff;
            *(undefined2 *)((long)param + 0x1494) = 1;
            *(undefined1 *)((long)param + 0x149c) = 0;
            *(undefined4 *)((long)param + 0x1498) = 1;
          }
        }
        else {
LAB_00169c8d:
          *(undefined4 *)((long)param + 0x1498) = 0;
          *(undefined2 *)((long)param + 0x1490) = *(undefined2 *)((long)param + 0x1492);
        }
      }
      (*outputs)[uVar30] = (int)*(short *)((long)param + 0x1e);
      outputs[1][uVar30] = (int)*(short *)((long)param + 0x20);
      uVar30 = uVar30 + 1;
    } while (uVar30 != samples);
  }
  return;
}

Assistant:

static void qsoundc_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	struct qsound_chip* chip = (struct qsound_chip*)param;
	UINT32 curSmpl;
	
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		update_sample(chip);
		outputs[0][curSmpl] = chip->out[0];
		outputs[1][curSmpl] = chip->out[1];
	}
	
	return;
}